

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_tests1.cpp
# Opt level: O2

void __thiscall
test::iu_ParamTest_x_iutest_x_NoParam_Test::Body(iu_ParamTest_x_iutest_x_NoParam_Test *this)

{
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_tests1.cpp"
             ,0x1e,"Succeeded.\n");
  local_1c0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
  return;
}

Assistant:

IUTEST_F(ParamTest, NoParam)
{
    IUTEST_SUCCEED();
}